

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

common_sampler * common_sampler_init(llama_model *model,common_params_sampling *params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  common_grammar_trigger_type cVar2;
  pointer pcVar3;
  pointer pcVar4;
  common_params_sampling *pcVar5;
  int iVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  long *plVar9;
  llama_sampler *plVar10;
  common_sampler *this;
  undefined8 uVar11;
  long *plVar12;
  size_type *psVar13;
  char *pcVar14;
  size_type __n;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex;
  pointer pbVar15;
  pointer pcVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pointer pcVar17;
  pointer pbVar18;
  vector<const_char_*,_std::allocator<const_char_*>_> trigger_patterns_c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  trigger_patterns;
  vector<int,_std::allocator<int>_> trigger_tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns_anywhere;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns_at_start;
  string local_148;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  void *local_e8;
  iterator iStack_e0;
  int *local_d8;
  undefined8 local_c8;
  pointer local_c0;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  llama_model *local_40;
  common_params_sampling *local_38;
  
  local_40 = model;
  uVar8 = llama_model_get_vocab();
  llama_sampler_chain_default_params();
  local_c0 = (pointer)CONCAT71(local_c0._1_7_,params->no_perf);
  iVar6 = std::__cxx11::string::compare((ulong)&params->grammar,0,(char *)0xb);
  if (iVar6 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
               ,0xa0,"llguidance (cmake -DLLAMA_LLGUIDANCE=ON) is not enabled");
  }
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8 = (int *)0x0;
  local_e8 = (void *)0x0;
  iStack_e0._M_current = (int *)0x0;
  pcVar17 = (params->grammar_triggers).
            super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (params->grammar_triggers).
           super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38 = params;
  if (pcVar17 == pcVar3) {
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    paVar1 = &local_148.field_2;
    local_c8 = uVar8;
    do {
      cVar2 = pcVar17->type;
      if (cVar2 - COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN < 2) {
        this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78;
        if (cVar2 == COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START) {
          this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00,&pcVar17->value);
      }
      else if (cVar2 == COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN) {
        local_148._M_dataplus._M_p._0_4_ = pcVar17->token;
        if (iStack_e0._M_current == local_d8) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_e8,iStack_e0,(int *)&local_148);
        }
        else {
          *iStack_e0._M_current = pcVar17->token;
          iStack_e0._M_current = iStack_e0._M_current + 1;
        }
      }
      else {
        if (cVar2 != COMMON_GRAMMAR_TRIGGER_TYPE_WORD) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                     ,0xbc,"GGML_ASSERT(%s) failed","false && \"unknown trigger type\"");
        }
        regex_escape(&local_148,&pcVar17->value);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   &local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = local_c8;
      pcVar17 = pcVar17 + 1;
    } while (pcVar17 != pcVar3);
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"|","");
      string_join(&local_98,&local_58,&local_b8);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x225225);
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_118 = *plVar12;
        lStack_110 = plVar9[3];
        local_128 = &local_118;
      }
      else {
        local_118 = *plVar12;
        local_128 = (long *)*plVar9;
      }
      local_120 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_148.field_2._M_allocated_capacity = *psVar13;
        local_148.field_2._8_8_ = plVar9[3];
        local_148._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_148.field_2._M_allocated_capacity = *psVar13;
        local_148._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_148._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                 &local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar1) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,local_118 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"|","");
    string_join(&local_98,&local_78,&local_b8);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x225231);
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_118 = *plVar12;
      lStack_110 = plVar9[3];
      local_128 = &local_118;
    }
    else {
      local_118 = *plVar12;
      local_128 = (long *)*plVar9;
    }
    local_120 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
    psVar13 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_148.field_2._M_allocated_capacity = *psVar13;
      local_148.field_2._8_8_ = plVar9[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar13;
      local_148._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_148._M_string_length = plVar9[1];
    *plVar9 = (long)psVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               &local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  local_148._M_dataplus._M_p = (pointer)0x0;
  local_148._M_string_length = 0;
  local_148.field_2._M_allocated_capacity = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_148,
             (long)local_108.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pcVar5 = local_38;
  pbVar18 = local_108.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar15 = local_108.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_128 = (long *)(pbVar15->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_148,(char **)&local_128);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 != pbVar18);
  }
  pcVar4 = (pcVar5->grammar)._M_dataplus._M_p;
  if (pcVar5->grammar_lazy == false) {
    plVar10 = (llama_sampler *)llama_sampler_init_grammar(uVar8,pcVar4,"root");
  }
  else {
    plVar10 = (llama_sampler *)
              llama_sampler_init_grammar_lazy_patterns
                        (uVar8,pcVar4,"root",local_148._M_dataplus._M_p,
                         (long)(local_148._M_string_length - (long)local_148._M_dataplus._M_p) >> 3,
                         local_e8,(long)iStack_e0._M_current - (long)local_e8 >> 2);
  }
  if (local_148._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_148._M_dataplus._M_p,
                    local_148.field_2._M_allocated_capacity - (long)local_148._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if (plVar10 == (llama_sampler *)0x0) {
    this = (common_sampler *)0x0;
  }
  else {
    this = (common_sampler *)operator_new(0x1a0);
    common_params_sampling::common_params_sampling((common_params_sampling *)this,pcVar5);
    this->grmr = plVar10;
    plVar10 = (llama_sampler *)llama_sampler_chain_init((ulong)local_c0 & 0xff);
    this->chain = plVar10;
    __n = 0x20;
    if (0x20 < pcVar5->n_prev) {
      __n = (size_type)(uint)pcVar5->n_prev;
    }
    (this->prev).capacity = __n;
    (this->prev).sz = 0;
    (this->prev).first = 0;
    (this->prev).pos = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&(this->prev).data,__n,(allocator_type *)&local_148);
    (this->cur_p).size = 0;
    (this->cur_p).selected = 0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->cur_p).data = (llama_token_data *)0x0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->cur).super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)&(this->cur_p).sorted = 0;
    plVar10 = this->chain;
    uVar7 = llama_vocab_n_tokens(uVar8);
    uVar11 = llama_sampler_init_logit_bias
                       (uVar7,(ulong)((long)(pcVar5->logit_bias).
                                            super__Vector_base<llama_logit_bias,_std::allocator<llama_logit_bias>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pcVar5->logit_bias).
                                           super__Vector_base<llama_logit_bias,_std::allocator<llama_logit_bias>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
    llama_sampler_chain_add(plVar10,uVar11);
    iVar6 = pcVar5->mirostat;
    if (iVar6 == 2) {
      plVar10 = this->chain;
      uVar8 = llama_sampler_init_temp(pcVar5->temp);
      llama_sampler_chain_add(plVar10,uVar8);
      plVar10 = this->chain;
      uVar8 = llama_sampler_init_mirostat_v2(pcVar5->mirostat_tau,pcVar5->mirostat_eta,pcVar5->seed)
      ;
    }
    else if (iVar6 == 1) {
      plVar10 = this->chain;
      uVar11 = llama_sampler_init_temp(pcVar5->temp);
      llama_sampler_chain_add(plVar10,uVar11);
      plVar10 = this->chain;
      uVar7 = llama_vocab_n_tokens(uVar8);
      uVar8 = llama_sampler_init_mirostat
                        (pcVar5->mirostat_tau,pcVar5->mirostat_eta,uVar7,pcVar5->seed,100);
    }
    else {
      if (iVar6 != 0) {
        pcVar14 = "false && \"unknown mirostat version\"";
        uVar8 = 0x11f;
LAB_0020e830:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                   ,uVar8,"GGML_ASSERT(%s) failed",pcVar14);
      }
      if (0.0 <= pcVar5->top_n_sigma) {
        plVar10 = this->chain;
        uVar8 = llama_sampler_init_top_k(pcVar5->top_k);
        llama_sampler_chain_add(plVar10,uVar8);
        plVar10 = this->chain;
        uVar8 = llama_sampler_init_temp(pcVar5->temp);
        llama_sampler_chain_add(plVar10,uVar8);
        plVar10 = this->chain;
        uVar8 = llama_sampler_init_top_n_sigma(pcVar5->top_n_sigma);
        llama_sampler_chain_add(plVar10,uVar8);
      }
      else {
        pcVar16 = (pcVar5->samplers).
                  super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_c0 = (pcVar5->samplers).
                   super__Vector_base<common_sampler_type,_std::allocator<common_sampler_type>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (pcVar16 != local_c0) {
          local_c8 = uVar8;
          do {
            switch(*pcVar16) {
            case COMMON_SAMPLER_TYPE_DRY:
              local_148._M_dataplus._M_p = (pointer)0x0;
              local_148._M_string_length = 0;
              local_148.field_2._M_allocated_capacity = 0;
              std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_148,
                         (long)(pcVar5->dry_sequence_breakers).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pcVar5->dry_sequence_breakers).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
              pbVar15 = (pcVar5->dry_sequence_breakers).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pbVar18 = (pcVar5->dry_sequence_breakers).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar15;
                  pbVar18 = pbVar18 + 1) {
                local_128 = (long *)(pbVar18->_M_dataplus)._M_p;
                std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                          ((vector<char_const*,std::allocator<char_const*>> *)&local_148,
                           (char **)&local_128);
              }
              plVar10 = this->chain;
              uVar7 = llama_model_n_ctx_train(local_40);
              uVar8 = local_c8;
              uVar11 = llama_sampler_init_dry
                                 (pcVar5->dry_multiplier,pcVar5->dry_base,local_c8,uVar7,
                                  pcVar5->dry_allowed_length,pcVar5->dry_penalty_last_n,
                                  local_148._M_dataplus._M_p,
                                  (long)(local_148._M_string_length -
                                        (long)local_148._M_dataplus._M_p) >> 3);
              llama_sampler_chain_add(plVar10,uVar11);
              if (local_148._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity -
                                (long)local_148._M_dataplus._M_p);
              }
              goto LAB_0020e628;
            case COMMON_SAMPLER_TYPE_TOP_K:
              plVar10 = this->chain;
              uVar11 = llama_sampler_init_top_k(pcVar5->top_k);
              break;
            case COMMON_SAMPLER_TYPE_TOP_P:
              plVar10 = this->chain;
              uVar11 = llama_sampler_init_top_p(pcVar5->top_p,(long)pcVar5->min_keep);
              break;
            case COMMON_SAMPLER_TYPE_MIN_P:
              plVar10 = this->chain;
              uVar11 = llama_sampler_init_min_p(pcVar5->min_p,(long)pcVar5->min_keep);
              break;
            default:
              pcVar14 = "false && \"unknown sampler type\"";
              uVar8 = 0x113;
              goto LAB_0020e830;
            case COMMON_SAMPLER_TYPE_TYPICAL_P:
              plVar10 = this->chain;
              uVar11 = llama_sampler_init_typical(pcVar5->typ_p,(long)pcVar5->min_keep);
              break;
            case COMMON_SAMPLER_TYPE_TEMPERATURE:
              plVar10 = this->chain;
              uVar11 = llama_sampler_init_temp_ext
                                 (pcVar5->temp,pcVar5->dynatemp_range,pcVar5->dynatemp_exponent);
              break;
            case COMMON_SAMPLER_TYPE_XTC:
              plVar10 = this->chain;
              uVar11 = llama_sampler_init_xtc
                                 (pcVar5->xtc_probability,pcVar5->xtc_threshold,
                                  (long)pcVar5->min_keep,pcVar5->seed);
              break;
            case COMMON_SAMPLER_TYPE_INFILL:
              plVar10 = this->chain;
              uVar11 = llama_sampler_init_infill(uVar8);
              break;
            case COMMON_SAMPLER_TYPE_PENALTIES:
              plVar10 = this->chain;
              uVar11 = llama_sampler_init_penalties
                                 (pcVar5->penalty_repeat,pcVar5->penalty_freq,
                                  pcVar5->penalty_present,pcVar5->penalty_last_n);
            }
            llama_sampler_chain_add(plVar10,uVar11);
LAB_0020e628:
            pcVar16 = pcVar16 + 1;
          } while (pcVar16 != local_c0);
        }
      }
      plVar10 = this->chain;
      uVar8 = llama_sampler_init_dist(pcVar5->seed);
    }
    llama_sampler_chain_add(plVar10,uVar8);
  }
  return this;
}

Assistant:

struct common_sampler * common_sampler_init(const struct llama_model * model, const struct common_params_sampling & params) {
    const llama_vocab * vocab = llama_model_get_vocab(model);

    llama_sampler_chain_params lparams = llama_sampler_chain_default_params();

    lparams.no_perf = params.no_perf;

    struct llama_sampler * grmr;
    if (params.grammar.compare(0, 11, "%llguidance") == 0) {
#ifdef LLAMA_USE_LLGUIDANCE
        grmr = llama_sampler_init_llg(vocab, "lark", params.grammar.c_str());
#else
        GGML_ABORT("llguidance (cmake -DLLAMA_LLGUIDANCE=ON) is not enabled");
#endif // LLAMA_USE_LLGUIDANCE
    } else {
        std::vector<std::string> patterns_at_start;
        std::vector<std::string> patterns_anywhere;
        std::vector<llama_token> trigger_tokens;
        for (const auto & trigger : params.grammar_triggers) {
            switch (trigger.type) {
                case COMMON_GRAMMAR_TRIGGER_TYPE_WORD:
                {
                    const auto & word = trigger.value;
                    patterns_anywhere.push_back(regex_escape(word));
                    break;
                }
                case COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN:
                case COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START:
                {
                    const auto & pattern = trigger.value;
                    (trigger.type == COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START ? patterns_at_start : patterns_anywhere).push_back(pattern);
                    break;
                }
                case COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN:
                {
                    const auto token = trigger.token;
                    trigger_tokens.push_back(token);
                    break;
                }
                default:
                    GGML_ASSERT(false && "unknown trigger type");
            }
        }

        std::vector<std::string> trigger_patterns;
        if (!patterns_at_start.empty()) {
            trigger_patterns.push_back("^(" + string_join(patterns_at_start, "|") + ")[\\s\\S]*");
        }
        if (!patterns_anywhere.empty()) {
            trigger_patterns.push_back("^[\\s\\S]*?(" + string_join(patterns_anywhere, "|") + ")[\\s\\S]*");
        }

        std::vector<const char *> trigger_patterns_c;
        trigger_patterns_c.reserve(trigger_patterns.size());
        for (const auto & regex : trigger_patterns) {
            trigger_patterns_c.push_back(regex.c_str());
        }

        grmr = params.grammar_lazy
             ? llama_sampler_init_grammar_lazy_patterns(vocab, params.grammar.c_str(), "root",
                                                        trigger_patterns_c.data(), trigger_patterns_c.size(),
                                                        trigger_tokens.data(), trigger_tokens.size())
             :      llama_sampler_init_grammar(vocab, params.grammar.c_str(), "root");
        if (!grmr) {
            return nullptr;
        }
    }

    auto * result = new common_sampler {
        /* .params = */ params,
        /* .grmr   = */ grmr,
        /* .chain  = */ llama_sampler_chain_init(lparams),
        /* .prev   = */ ring_buffer<llama_token>(std::max(32, params.n_prev)),
        /* .cur    = */ {},
        /* .cur_p  = */ {},
    };

    llama_sampler_chain_add(result->chain,
            llama_sampler_init_logit_bias(
                llama_vocab_n_tokens(vocab),
                params.logit_bias.size(),
                params.logit_bias.data()));

    if (params.mirostat == 0) {
        if (params.top_n_sigma >= 0) {
            llama_sampler_chain_add(result->chain, llama_sampler_init_top_k        (params.top_k));
            llama_sampler_chain_add(result->chain, llama_sampler_init_temp         (params.temp));
            llama_sampler_chain_add(result->chain, llama_sampler_init_top_n_sigma  (params.top_n_sigma));
        } else {
            for (const auto & cnstr : params.samplers) {
                switch (cnstr) {
                    case COMMON_SAMPLER_TYPE_DRY:
                        {
                            std::vector<const char *> c_breakers;
                            c_breakers.reserve(params.dry_sequence_breakers.size());
                            for (const auto & str : params.dry_sequence_breakers) {
                                c_breakers.push_back(str.c_str());
                            }

                            llama_sampler_chain_add(result->chain, llama_sampler_init_dry      (vocab, llama_model_n_ctx_train(model), params.dry_multiplier, params.dry_base, params.dry_allowed_length, params.dry_penalty_last_n, c_breakers.data(), c_breakers.size()));
                        }
                        break;
                    case COMMON_SAMPLER_TYPE_TOP_K:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_top_k    (params.top_k));
                        break;
                    case COMMON_SAMPLER_TYPE_TOP_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_top_p    (params.top_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_MIN_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_min_p    (params.min_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_XTC:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_xtc      (params.xtc_probability, params.xtc_threshold, params.min_keep, params.seed));
                        break;
                    case COMMON_SAMPLER_TYPE_TYPICAL_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_typical  (params.typ_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_TEMPERATURE:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_temp_ext (params.temp, params.dynatemp_range, params.dynatemp_exponent));
                        break;
                    case COMMON_SAMPLER_TYPE_INFILL:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_infill   (vocab));
                        break;
                    case COMMON_SAMPLER_TYPE_PENALTIES:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_penalties(params.penalty_last_n, params.penalty_repeat, params.penalty_freq, params.penalty_present));
                        break;
                    default:
                        GGML_ASSERT(false && "unknown sampler type");
                }
            }
        }
        llama_sampler_chain_add(result->chain, llama_sampler_init_dist(params.seed));
    } else if (params.mirostat == 1) {
        llama_sampler_chain_add(result->chain, llama_sampler_init_temp(params.temp));
        llama_sampler_chain_add(result->chain, llama_sampler_init_mirostat(llama_vocab_n_tokens(vocab), params.seed, params.mirostat_tau, params.mirostat_eta, 100));
    } else if (params.mirostat == 2) {
        llama_sampler_chain_add(result->chain, llama_sampler_init_temp(params.temp));
        llama_sampler_chain_add(result->chain, llama_sampler_init_mirostat_v2(params.seed, params.mirostat_tau, params.mirostat_eta));
    } else {
        GGML_ASSERT(false && "unknown mirostat version");
    }

    return result;
}